

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O0

int vardata_add_varset(vardata *data,char *name,char *description)

{
  int iVar1;
  char *pcVar2;
  vardata_varset *pvVar3;
  vardata_varset new;
  int res;
  char *description_local;
  char *name_local;
  vardata *data_local;
  
  if (data->validated != 0) {
    abort();
  }
  iVar1 = symtab_put(data->symtab,name,2,data->varsetsnum);
  if (iVar1 == -1) {
    data_local._4_4_ = -1;
  }
  else {
    data_local._4_4_ = data->varsetsnum;
    pcVar2 = strdup(name);
    new.name = (char *)0x0;
    if (description != (char *)0x0) {
      new.name = strdup(description);
    }
    if (data->varsetsmax <= data->varsetsnum) {
      if (data->varsetsmax == 0) {
        data->varsetsmax = 0x10;
      }
      else {
        data->varsetsmax = data->varsetsmax << 1;
      }
      pvVar3 = (vardata_varset *)realloc(data->varsets,(long)data->varsetsmax << 4);
      data->varsets = pvVar3;
    }
    pvVar3 = data->varsets;
    iVar1 = data->varsetsnum;
    data->varsetsnum = iVar1 + 1;
    pvVar3[iVar1].name = pcVar2;
    pvVar3[iVar1].description = new.name;
  }
  return data_local._4_4_;
}

Assistant:

int vardata_add_varset(struct vardata *data, const char *name, const char *description) {
	if (data->validated)
		abort();
	if (symtab_put(data->symtab, name, VARDATA_ST_VARSET, data->varsetsnum) == -1)
		return -1;
	int res = data->varsetsnum;
	struct vardata_varset new = { strdup(name) };
	if (description)
		new.description = strdup(description);
	ADDARRAY(data->varsets, new);
	return res;
}